

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)9>_> *
vkt::pipeline::anon_unknown_0::createImage2DAndBindMemory
          (Move<vk::Handle<(vk::HandleType)9>_> *__return_storage_ptr__,Context *context,
          VkFormat format,deUint32 width,deUint32 height,VkImageUsageFlags usage,
          VkSampleCountFlagBits sampleCount,
          MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *pAlloc)

{
  Allocation *pAVar1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  VkResult result;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *pAVar2;
  undefined4 in_stack_0000000c;
  deUint32 queueFamilyIndex;
  undefined8 in_stack_ffffffffffffff38;
  UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_b8;
  deUint32 local_a4;
  VkMemoryRequirements local_a0;
  VkImageCreateInfo local_88;
  
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  local_a4 = Context::getUniversalQueueFamilyIndex(context);
  local_88.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_88.pNext = (void *)0x0;
  local_88.flags = 0;
  local_88.imageType = VK_IMAGE_TYPE_2D;
  local_88.extent.depth = 1;
  local_88.mipLevels = 1;
  local_88.arrayLayers = 1;
  local_88.samples = VK_SAMPLE_COUNT_1_BIT;
  local_88.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_88.pQueueFamilyIndices = &local_a4;
  local_88.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_88.queueFamilyIndexCount = 1;
  local_88.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_88.format = format;
  local_88.extent.width = width;
  local_88.extent.height = height;
  local_88.usage = usage;
  ::vk::createImage(__return_storage_ptr__,vk,device,&local_88,(VkAllocationCallbacks *)0x0);
  pAVar2 = Context::getDefaultAllocator(context);
  ::vk::getImageMemoryRequirements
            (&local_a0,vk,device,
             (VkImage)(__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data
                      .object.m_internal);
  (*pAVar2->_vptr_Allocator[3])(&local_b8,pAVar2,&local_a0,0);
  local_b8.m_data.ptr = (Allocation *)0x0;
  data._8_4_ = height;
  data.ptr = (Allocation *)in_stack_ffffffffffffff38;
  data._12_4_ = usage;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::assignData
            ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             CONCAT44(in_stack_0000000c,sampleCount),data);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&local_b8);
  pAVar1 = (((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
            CONCAT44(in_stack_0000000c,sampleCount))->m_data).ptr;
  result = (*vk->_vptr_DeviceInterface[0xd])
                     (vk,device,
                      (__return_storage_ptr__->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data
                      .object.m_internal,(pAVar1->m_memory).m_internal,pAVar1->m_offset);
  ::vk::checkResult(result,
                    "vk.bindImageMemory(vkDevice, *image, (*pAlloc)->getMemory(), (*pAlloc)->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x1f1);
  return __return_storage_ptr__;
}

Assistant:

Move<VkImage> createImage2DAndBindMemory (Context&                          context,
										  VkFormat                          format,
										  deUint32                          width,
										  deUint32                          height,
										  VkImageUsageFlags                 usage,
										  VkSampleCountFlagBits             sampleCount,
										  de::details::MovePtr<Allocation>* pAlloc)
{
	const DeviceInterface&  vk               = context.getDeviceInterface();
	const VkDevice          vkDevice         = context.getDevice();
	const deUint32          queueFamilyIndex = context.getUniversalQueueFamilyIndex();

	const VkImageCreateInfo colorImageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,                                        // VkStructureType      sType;
		DE_NULL,                                                                    // const void*          pNext;
		0u,                                                                         // VkImageCreateFlags   flags;
		VK_IMAGE_TYPE_2D,                                                           // VkImageType          imageType;
		format,                                                                     // VkFormat             format;
		{ width, height, 1u },                                                      // VkExtent3D           extent;
		1u,                                                                         // deUint32             mipLevels;
		1u,                                                                         // deUint32             arraySize;
		sampleCount,                                                                // deUint32             samples;
		VK_IMAGE_TILING_OPTIMAL,                                                    // VkImageTiling        tiling;
		usage,                                                                      // VkImageUsageFlags    usage;
		VK_SHARING_MODE_EXCLUSIVE,                                                  // VkSharingMode        sharingMode;
		1u,                                                                         // deUint32             queueFamilyCount;
		&queueFamilyIndex,                                                          // const deUint32*      pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,                                                  // VkImageLayout        initialLayout;
	};

	Move<VkImage> image = createImage(vk, vkDevice, &colorImageParams);

	*pAlloc = context.getDefaultAllocator().allocate(getImageMemoryRequirements(vk, vkDevice, *image), MemoryRequirement::Any);
	VK_CHECK(vk.bindImageMemory(vkDevice, *image, (*pAlloc)->getMemory(), (*pAlloc)->getOffset()));

	return image;
}